

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

void __thiscall S2Loop::InitBound(S2Loop *this)

{
  bool bVar1;
  int iVar2;
  S2LatLngRect *pSVar3;
  S2Point *b_00;
  S1Interval *this_00;
  R1Interval *pRVar4;
  double lo;
  bool local_1da;
  S2LatLngRect local_190;
  Vector3<double> local_168;
  S1Interval local_150;
  R1Interval local_140;
  S2LatLngRect local_130;
  Vector3<double> local_108;
  undefined1 local_f0 [8];
  S2LatLngRect b;
  int local_b4;
  undefined1 local_b0 [4];
  int i;
  S2LatLngRectBounder bounder;
  S2LatLngRect local_38;
  S2Loop *local_10;
  S2Loop *this_local;
  
  local_10 = this;
  bVar1 = is_empty_or_full(this);
  if (bVar1) {
    bVar1 = is_empty(this);
    if (bVar1) {
      S2LatLngRect::Empty();
      pSVar3 = S2LatLngRect::operator=(&this->bound_,&local_38);
      S2LatLngRect::operator=(&this->subregion_bound_,pSVar3);
      S2LatLngRect::~S2LatLngRect(&local_38);
    }
    else {
      S2LatLngRect::Full();
      pSVar3 = S2LatLngRect::operator=
                         (&this->bound_,(S2LatLngRect *)(bounder.bound_.lng_.bounds_.c_ + 1));
      S2LatLngRect::operator=(&this->subregion_bound_,pSVar3);
      S2LatLngRect::~S2LatLngRect((S2LatLngRect *)(bounder.bound_.lng_.bounds_.c_ + 1));
    }
  }
  else {
    S2LatLngRectBounder::S2LatLngRectBounder((S2LatLngRectBounder *)local_b0);
    for (local_b4 = 0; iVar2 = num_vertices(this), local_b4 <= iVar2; local_b4 = local_b4 + 1) {
      b_00 = vertex(this,local_b4);
      S2LatLngRectBounder::AddPoint((S2LatLngRectBounder *)local_b0,b_00);
    }
    S2LatLngRectBounder::GetBound((S2LatLngRect *)local_f0,(S2LatLngRectBounder *)local_b0);
    Vector3<double>::Vector3(&local_108,0.0,0.0,1.0);
    bVar1 = Contains(this,&local_108);
    if (bVar1) {
      pRVar4 = S2LatLngRect::lat((S2LatLngRect *)local_f0);
      lo = R1Interval::lo(pRVar4);
      R1Interval::R1Interval(&local_140,lo,1.5707963267948966);
      local_150 = S1Interval::Full();
      S2LatLngRect::S2LatLngRect(&local_130,&local_140,&local_150);
      S2LatLngRect::operator=((S2LatLngRect *)local_f0,&local_130);
      S2LatLngRect::~S2LatLngRect(&local_130);
    }
    this_00 = S2LatLngRect::lng((S2LatLngRect *)local_f0);
    bVar1 = S1Interval::is_full(this_00);
    local_1da = false;
    if (bVar1) {
      Vector3<double>::Vector3(&local_168,0.0,0.0,-1.0);
      local_1da = Contains(this,&local_168);
    }
    if (local_1da != false) {
      pRVar4 = S2LatLngRect::mutable_lat((S2LatLngRect *)local_f0);
      R1Interval::set_lo(pRVar4,-1.5707963267948966);
    }
    S2LatLngRect::operator=(&this->bound_,(S2LatLngRect *)local_f0);
    S2LatLngRectBounder::ExpandForSubregions(&local_190,&this->bound_);
    S2LatLngRect::operator=(&this->subregion_bound_,&local_190);
    S2LatLngRect::~S2LatLngRect(&local_190);
    S2LatLngRect::~S2LatLngRect((S2LatLngRect *)local_f0);
    S2LatLngRectBounder::~S2LatLngRectBounder((S2LatLngRectBounder *)local_b0);
  }
  return;
}

Assistant:

void S2Loop::InitBound() {
  // Check for the special empty and full loops.
  if (is_empty_or_full()) {
    if (is_empty()) {
      subregion_bound_ = bound_ = S2LatLngRect::Empty();
    } else {
      subregion_bound_ = bound_ = S2LatLngRect::Full();
    }
    return;
  }

  // The bounding rectangle of a loop is not necessarily the same as the
  // bounding rectangle of its vertices.  First, the maximal latitude may be
  // attained along the interior of an edge.  Second, the loop may wrap
  // entirely around the sphere (e.g. a loop that defines two revolutions of a
  // candy-cane stripe).  Third, the loop may include one or both poles.
  // Note that a small clockwise loop near the equator contains both poles.

  S2LatLngRectBounder bounder;
  for (int i = 0; i <= num_vertices(); ++i) {
    bounder.AddPoint(vertex(i));
  }
  S2LatLngRect b = bounder.GetBound();
  if (Contains(S2Point(0, 0, 1))) {
    b = S2LatLngRect(R1Interval(b.lat().lo(), M_PI_2), S1Interval::Full());
  }
  // If a loop contains the south pole, then either it wraps entirely
  // around the sphere (full longitude range), or it also contains the
  // north pole in which case b.lng().is_full() due to the test above.
  // Either way, we only need to do the south pole containment test if
  // b.lng().is_full().
  if (b.lng().is_full() && Contains(S2Point(0, 0, -1))) {
    b.mutable_lat()->set_lo(-M_PI_2);
  }
  bound_ = b;
  subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);
}